

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

uint64 Js::JavascriptExceptionOperators::GetStackTraceLimit
                 (Var thrownObject,ScriptContext *scriptContext)

{
  Type TVar1;
  RuntimeFunction *instance;
  code *pcVar2;
  Var pvVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  RecyclableObject *pRVar7;
  undefined4 *puVar8;
  uint64 uVar9;
  DisableImplicitFlags DVar10;
  HRESULT HVar11;
  Var local_48;
  Var var;
  HRESULT local_34;
  
  if ((((scriptContext->config).threadConfig)->m_errorStackTrace != true) ||
     (bVar4 = IsErrorInstance(thrownObject), !bVar4)) {
    return 0;
  }
  pRVar7 = VarTo<Js::RecyclableObject>(thrownObject);
  local_34 = JavascriptError::GetRuntimeError(pRVar7,(LPCWSTR *)0x0);
  instance = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).errorConstructor.ptr;
  DVar10 = scriptContext->threadContext->disableImplicitFlags;
  if (local_34 == -0x7ff5ffe4) {
    scriptContext->threadContext->disableImplicitFlags = DisableImplicitCallAndExceptionFlag;
  }
  local_48 = (Var)0x0;
  BVar5 = JavascriptOperators::GetPropertyNoCache
                    ((RecyclableObject *)instance,0x162,&local_48,scriptContext);
  pvVar3 = local_48;
  if (BVar5 != 0) {
    if (local_48 == (Var)0x0) {
      var = (Var)CONCAT71(var._1_7_,DVar10);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a94ff4;
      *puVar8 = 0;
      DVar10 = (DisableImplicitFlags)var;
LAB_00a94de5:
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar3);
      if (pRVar7 == (RecyclableObject *)0x0) {
        var = (Var)CONCAT71(var._1_7_,DVar10);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00a94ff4;
        *puVar8 = 0;
        DVar10 = (DisableImplicitFlags)var;
      }
      TVar1 = ((pRVar7->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 - TypeIds_FirstNumberType < 4) goto LAB_00a94e78;
      }
      else {
        BVar5 = RecyclableObject::IsExternal(pRVar7);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar4) goto LAB_00a94ff4;
          *puVar8 = 0;
        }
      }
      uVar9 = 0;
      HVar11 = local_34;
      goto LAB_00a94fa4;
    }
    if (((ulong)local_48 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)local_48 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)local_48 >> 0x32 == 0 && ((ulong)local_48 & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00a94de5;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00a94ff4;
      *puVar8 = 0;
    }
LAB_00a94e78:
    pvVar3 = local_48;
    if (((ulong)local_48 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)local_48 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)local_48 & 0xffff000000000000) == 0x1000000000000) goto LAB_00a94ef9;
      if ((ulong)local_48 >> 0x32 == 0) {
        var = (Var)JavascriptConversion::ToNumber_Full(local_48,scriptContext);
      }
      else {
        var = (Var)((ulong)local_48 ^ 0xfffc000000000000);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) {
LAB_00a94ff4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
LAB_00a94ef9:
      var = (Var)(double)(int)pvVar3;
    }
    bVar4 = NumberUtilities::IsNan((double)var);
    HVar11 = local_34;
    if (!bVar4) {
      bVar4 = NumberUtilities::IsFinite((double)var);
      uVar9 = 0xffffffffffffffff;
      if (bVar4) {
        uVar6 = JavascriptConversion::ToUInt32(local_48,scriptContext);
        uVar9 = (uint64)uVar6;
      }
      goto LAB_00a94fa4;
    }
  }
  uVar9 = 0;
  HVar11 = local_34;
LAB_00a94fa4:
  if (HVar11 != -0x7ff5ffe4) {
    return uVar9;
  }
  scriptContext->threadContext->disableImplicitFlags = DVar10;
  return uVar9;
}

Assistant:

uint64 JavascriptExceptionOperators::GetStackTraceLimit(Var thrownObject, ScriptContext* scriptContext)
    {
        uint64 limit = 0;

        if (scriptContext->GetConfig()->IsErrorStackTraceEnabled()
            && IsErrorInstance(thrownObject))
        {
            HRESULT hr = JavascriptError::GetRuntimeError(VarTo<RecyclableObject>(thrownObject), NULL);
            JavascriptFunction* error = scriptContext->GetLibrary()->GetErrorConstructor();

            // If we are throwing StackOverflow and Error.stackTraceLimit is a custom getter, we can't make the getter
            // call as we don't have stack space. Just bail out without stack trace in such case. Only proceed to get
            // Error.stackTraceLimit property if we are not throwing StackOverflow, or there is no implicitCall (in getter case).
            DisableImplicitFlags disableImplicitFlags = scriptContext->GetThreadContext()->GetDisableImplicitFlags();
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(DisableImplicitCallAndExceptionFlag);
            }

            Var var = nullptr;
            if (JavascriptOperators::GetPropertyNoCache(error, PropertyIds::stackTraceLimit, &var, scriptContext))
            {
                // Only accept the value if it is a "Number". Avoid potential valueOf() call.
                switch (JavascriptOperators::GetTypeId(var))
                {
                case TypeIds_Integer:
                case TypeIds_Number:
                case TypeIds_Int64Number:
                case TypeIds_UInt64Number:
                    double value = JavascriptConversion::ToNumber(var, scriptContext);
                    limit = JavascriptNumber::IsNan(value) ? 0 :
                        (NumberUtilities::IsFinite(value) ? JavascriptConversion::ToUInt32(var, scriptContext) : MaxStackTraceLimit);
                    break;
                }
            }
            if (hr == VBSERR_OutOfStack)
            {
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(disableImplicitFlags);
            }
    }

        return limit;
    }